

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psemaphore-posix.c
# Opt level: O2

void p_semaphore_free(PSemaphore *sem)

{
  if (sem != (PSemaphore *)0x0) {
    pp_semaphore_clean_handle(sem);
    if (sem->platform_key != (pchar *)0x0) {
      p_free(sem->platform_key);
    }
    p_free(sem);
    return;
  }
  return;
}

Assistant:

P_LIB_API void
p_semaphore_free (PSemaphore *sem)
{
	if (P_UNLIKELY (sem == NULL))
		return;

	pp_semaphore_clean_handle (sem);

	if (P_LIKELY (sem->platform_key != NULL))
		p_free (sem->platform_key);

	p_free (sem);
}